

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::RawHashSetLayout::RawHashSetLayout
          (RawHashSetLayout *this,size_t capacity,size_t slot_align,bool has_infoz)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  
  this->capacity_ = capacity;
  uVar1 = CONCAT71(in_register_00000009,has_infoz) & 0xffffffff;
  this->control_offset_ = uVar1 + 8;
  this->generation_offset_ = uVar1 + capacity + 0x18;
  this->slot_offset_ = -slot_align & slot_align + capacity + uVar1 + 0x17;
  if ((capacity != 0) && ((capacity + 1 & capacity) == 0)) {
    return;
  }
  __assert_fail("(IsValidCapacity(capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x4b8,
                "absl::container_internal::RawHashSetLayout::RawHashSetLayout(size_t, size_t, bool)"
               );
}

Assistant:

explicit RawHashSetLayout(size_t capacity, size_t slot_align, bool has_infoz)
      : capacity_(capacity),
        control_offset_(ControlOffset(has_infoz)),
        generation_offset_(control_offset_ + NumControlBytes(capacity)),
        slot_offset_(
            (generation_offset_ + NumGenerationBytes() + slot_align - 1) &
            (~slot_align + 1)) {
    ABSL_SWISSTABLE_ASSERT(IsValidCapacity(capacity));
  }